

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::BinaryWriter::startNewEntity(BinaryWriter *this)

{
  value_type *in_RDI;
  stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
  *this_00;
  
  this_00 = (stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
             *)&stack0xffffffffffffffe8;
  std::make_shared<pbrt::SerializedEntity>();
  std::
  stack<std::shared_ptr<pbrt::SerializedEntity>,_std::deque<std::shared_ptr<pbrt::SerializedEntity>,_std::allocator<std::shared_ptr<pbrt::SerializedEntity>_>_>_>
  ::push(this_00,in_RDI);
  std::shared_ptr<pbrt::SerializedEntity>::~shared_ptr
            ((shared_ptr<pbrt::SerializedEntity> *)0x22d6db);
  return;
}

Assistant:

void startNewEntity()
    { serializedEntity.push(std::make_shared<SerializedEntity>()); }